

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  int r_rel [4];
  
  pIVar1 = GImGui;
  fVar4 = (this->Pos).x;
  fVar5 = (this->Pos).y;
  r_rel[0] = (int)((r_abs->Min).x - fVar4);
  r_rel[1] = (int)((r_abs->Min).y - fVar5);
  r_rel[2] = (int)((r_abs->Max).x - fVar4);
  r_rel[3] = (int)((r_abs->Max).y - fVar5);
  uVar2 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar3 = 0;
  do {
    uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)r_rel + lVar3) ^ uVar2 & 0xff];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  uVar2 = ~uVar2;
  if (GImGui->ActiveId == uVar2) {
    GImGui->ActiveIdIsAlive = uVar2;
  }
  if (pIVar1->ActiveIdPreviousFrame == uVar2) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  return uVar2;
}

Assistant:

inline T&           back()                              { IM_ASSERT(Size > 0); return Data[Size - 1]; }